

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O0

bool P_CheckSight(AActor *t1,AActor *t2,int flags)

{
  AActor *ctx;
  bool bVar1;
  uint uVar2;
  sector_t_conflict *psVar3;
  SightTask *pSVar4;
  double dVar5;
  double dVar6;
  int local_148;
  byte local_142;
  byte local_141;
  uint local_13c;
  uint i;
  double dist;
  SightCheck s;
  SightTask task;
  double topslope;
  double bottomslope;
  double local_50;
  double lookheight;
  sector_t_conflict *sec;
  sector_t *psStack_38;
  int pnum;
  sector_t_conflict *s2;
  sector_t_conflict *s1;
  bool res;
  AActor *pAStack_20;
  int flags_local;
  AActor *t2_local;
  AActor *t1_local;
  
  s1._4_4_ = flags;
  pAStack_20 = t2;
  t2_local = t1;
  cycle_t::Clock(&SightCycles);
  if (t2_local == (AActor *)0x0) {
    __assert_fail("t1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                  ,0x32f,"bool P_CheckSight(AActor *, AActor *, int)");
  }
  if (pAStack_20 == (AActor *)0x0) {
    __assert_fail("t2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                  ,0x330,"bool P_CheckSight(AActor *, AActor *, int)");
  }
  if ((t2_local == (AActor *)0x0) || (pAStack_20 == (AActor *)0x0)) {
    return false;
  }
  s2 = (sector_t_conflict *)t2_local->Sector;
  psStack_38 = pAStack_20->Sector;
  sec._4_4_ = (int)(((long)s2 - (long)sectors) / 0x218) * numsectors +
              (int)(((long)psStack_38 - (long)sectors) / 0x218);
  if ((rejectmatrix != (BYTE *)0x0) &&
     (((uint)rejectmatrix[sec._4_4_ >> 3] & 1 << ((byte)sec._4_4_ & 7)) != 0)) {
    sightcounts[0] = sightcounts[0] + 1;
    s1._3_1_ = 0;
    goto LAB_005f6936;
  }
  local_141 = 0;
  if ((s1._4_4_ & 1) == 0) {
    TFlags<ActorRenderFlag,_unsigned_int>::operator&
              ((TFlags<ActorRenderFlag,_unsigned_int> *)&sec,(int)pAStack_20 + 0x10c);
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&sec);
    local_142 = 1;
    if (uVar2 == 0) {
      bVar1 = FRenderStyle::IsVisible
                        ((FRenderStyle *)&(pAStack_20->RenderStyle).field_0,pAStack_20->Alpha);
      local_142 = bVar1 ^ 0xff;
    }
    local_141 = local_142;
  }
  if ((local_141 & 1) != 0) {
    if ((bglobal.m_Thinking & 1U) == 0) {
      local_148 = FRandom::operator()(&pr_checksight);
    }
    else {
      local_148 = FRandom::operator()(&pr_botchecksight);
    }
    if (0x32 < local_148) {
      s1._3_1_ = 0;
      goto LAB_005f6936;
    }
  }
  if ((s1._4_4_ & 8) == 0) {
    psVar3 = sector_t::GetHeightSec((sector_t *)s2);
    if (psVar3 != (sector_t_conflict *)0x0) {
      dVar5 = AActor::Top(t2_local);
      dVar6 = secplane_t::ZatPoint(&s2->heightsec->floorplane,t2_local);
      if (dVar6 < dVar5) {
LAB_005f65a3:
        dVar5 = AActor::Z(t2_local);
        dVar6 = secplane_t::ZatPoint(&s2->heightsec->ceilingplane,t2_local);
        if (dVar6 <= dVar5) {
          dVar5 = AActor::Top(pAStack_20);
          dVar6 = secplane_t::ZatPoint(&s2->heightsec->ceilingplane,pAStack_20);
          if (dVar5 <= dVar6) goto LAB_005f671f;
        }
        goto LAB_005f661e;
      }
      dVar5 = AActor::Z(pAStack_20);
      dVar6 = secplane_t::ZatPoint(&s2->heightsec->floorplane,pAStack_20);
      if (dVar5 < dVar6) goto LAB_005f65a3;
LAB_005f671f:
      s1._3_1_ = 0;
      goto LAB_005f6936;
    }
LAB_005f661e:
    psVar3 = sector_t::GetHeightSec(psStack_38);
    if (psVar3 != (sector_t_conflict *)0x0) {
      dVar5 = AActor::Top(pAStack_20);
      dVar6 = secplane_t::ZatPoint(&psStack_38->heightsec->floorplane,pAStack_20);
      if (dVar5 <= dVar6) {
        dVar5 = AActor::Z(t2_local);
        dVar6 = secplane_t::ZatPoint(&psStack_38->heightsec->floorplane,t2_local);
        if (dVar6 <= dVar5) goto LAB_005f671f;
      }
      dVar5 = AActor::Z(pAStack_20);
      dVar6 = secplane_t::ZatPoint(&psStack_38->heightsec->ceilingplane,pAStack_20);
      if (dVar6 <= dVar5) {
        dVar5 = AActor::Top(t2_local);
        dVar6 = secplane_t::ZatPoint(&psStack_38->heightsec->ceilingplane,t2_local);
        if (dVar5 <= dVar6) goto LAB_005f671f;
      }
    }
  }
  validcount = validcount + 1;
  TArray<SightTask,_SightTask>::Clear(&portals);
  local_50 = AActor::Z(t2_local);
  local_50 = local_50 + t2_local->Height * 0.75;
  AActor::GetPortalTransition((DVector3 *)&bottomslope,t2_local,local_50,(sector_t **)&lookheight);
  AActor::Z(pAStack_20);
  s.portalfound = false;
  s._145_3_ = 0;
  s.myseethrough = 0;
  SightCheck::SightCheck((SightCheck *)&dist);
  SightCheck::init((SightCheck *)&dist,(EVP_PKEY_CTX *)t2_local);
  s1._3_1_ = SightCheck::P_SightPathTraverse((SightCheck *)&dist);
  if (!(bool)s1._3_1_) {
    dVar5 = AActor::Distance2D(t2_local,pAStack_20,false);
    for (local_13c = 0; uVar2 = TArray<SightTask,_SightTask>::Size(&portals), local_13c < uVar2;
        local_13c = local_13c + 1) {
      pSVar4 = TArray<SightTask,_SightTask>::operator[](&portals,(ulong)local_13c);
      ctx = t2_local;
      pSVar4->Frac = 1.0 / dVar5 + pSVar4->Frac;
      TArray<SightTask,_SightTask>::operator[](&portals,(ulong)local_13c);
      SightCheck::init((SightCheck *)&dist,(EVP_PKEY_CTX *)ctx);
      bVar1 = SightCheck::P_SightPathTraverse((SightCheck *)&dist);
      if (bVar1) {
        s1._3_1_ = 1;
        break;
      }
    }
  }
LAB_005f6936:
  cycle_t::Unclock(&SightCycles);
  return (bool)(s1._3_1_ & 1);
}

Assistant:

bool P_CheckSight (AActor *t1, AActor *t2, int flags)
{
	SightCycles.Clock();

	bool res;

	assert (t1 != NULL);
	assert (t2 != NULL);
	if (t1 == NULL || t2 == NULL)
	{
		return false;
	}

	const sector_t *s1 = t1->Sector;
	const sector_t *s2 = t2->Sector;
	int pnum = int(s1 - sectors) * numsectors + int(s2 - sectors);

//
// check for trivial rejection
//
	if (rejectmatrix != NULL &&
		(rejectmatrix[pnum>>3] & (1 << (pnum & 7))))
	{
sightcounts[0]++;
		res = false;			// can't possibly be connected
		goto done;
	}

//
// check precisely
//
	// [RH] Andy Baker's stealth monsters:
	// Cannot see an invisible object
	if ((flags & SF_IGNOREVISIBILITY) == 0 && ((t2->renderflags & RF_INVISIBLE) || !t2->RenderStyle.IsVisible(t2->Alpha)))
	{ // small chance of an attack being made anyway
		if ((bglobal.m_Thinking ? pr_botchecksight() : pr_checksight()) > 50)
		{
			res = false;
			goto done;
		}
	}

	// killough 4/19/98: make fake floors and ceilings block monster view

	if (!(flags & SF_IGNOREWATERBOUNDARY))
	{
		if ((s1->GetHeightSec() &&
			((t1->Top() <= s1->heightsec->floorplane.ZatPoint(t1) &&
			  t2->Z() >= s1->heightsec->floorplane.ZatPoint(t2)) ||
			 (t1->Z() >= s1->heightsec->ceilingplane.ZatPoint(t1) &&
			  t2->Top() <= s1->heightsec->ceilingplane.ZatPoint(t2))))
			||
			(s2->GetHeightSec() &&
			 ((t2->Top() <= s2->heightsec->floorplane.ZatPoint(t2) &&
			   t1->Z() >= s2->heightsec->floorplane.ZatPoint(t1)) ||
			  (t2->Z() >= s2->heightsec->ceilingplane.ZatPoint(t2) &&
			   t1->Top() <= s2->heightsec->ceilingplane.ZatPoint(t1)))))
		{
			res = false;
			goto done;
		}
	}

	// An unobstructed LOS is possible.
	// Now look from eyes of t1 to any part of t2.

	validcount++;
	portals.Clear();
	{
		sector_t *sec;
		double lookheight = t1->Z() + t1->Height*0.75;
		t1->GetPortalTransition(lookheight, &sec);

		double bottomslope = t2->Z() - lookheight;
		double topslope = bottomslope + t2->Height;
		SightTask task = { 0, topslope, bottomslope, -1, sec->PortalGroup };


		SightCheck s;
		s.init(t1, t2, sec, &task, flags);
		res = s.P_SightPathTraverse ();
		if (!res)
		{
			double dist = t1->Distance2D(t2);
			for (unsigned i = 0; i < portals.Size(); i++)
			{
				portals[i].Frac += 1 / dist;
				s.init(t1, t2, NULL, &portals[i], flags);
				if (s.P_SightPathTraverse())
				{
					res = true;
					break;
				}
			}
		}
	}

done:
	SightCycles.Unclock();
	return res;
}